

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_warp_plane_sse4.c
# Opt level: O0

void highbd_prepare_horizontal_filter_coeff_alpha0(int sx,__m128i *coeff)

{
  longlong lVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  WarpedFilterCoeff aWVar6 [8];
  WarpedFilterCoeff aWVar7 [8];
  WarpedFilterCoeff aWVar8 [8];
  WarpedFilterCoeff (*paWVar9) [8];
  __m128i alVar10;
  __m128i tmp_0;
  __m128i *coeff_local;
  int sx_local;
  
  paWVar9 = av1_warped_filter + (sx >> 10);
  aWVar8 = *paWVar9;
  aWVar7 = *paWVar9;
  aWVar6 = *paWVar9;
  auVar5[8] = '\0';
  auVar5[9] = '\x01';
  auVar5[10] = '\x02';
  auVar5[0xb] = '\x03';
  auVar5[0xc] = '\0';
  auVar5[0xd] = '\x01';
  auVar5[0xe] = '\x02';
  auVar5[0xf] = '\x03';
  auVar5[0] = '\0';
  auVar5[1] = '\x01';
  auVar5[2] = '\x02';
  auVar5[3] = '\x03';
  auVar5[4] = '\0';
  auVar5[5] = '\x01';
  auVar5[6] = '\x02';
  auVar5[7] = '\x03';
  alVar10 = (__m128i)pshufb((undefined1  [16])*paWVar9,auVar5);
  *coeff = alVar10;
  auVar4[8] = '\x04';
  auVar4[9] = '\x05';
  auVar4[10] = '\x06';
  auVar4[0xb] = '\a';
  auVar4[0xc] = '\x04';
  auVar4[0xd] = '\x05';
  auVar4[0xe] = '\x06';
  auVar4[0xf] = '\a';
  auVar4[0] = '\x04';
  auVar4[1] = '\x05';
  auVar4[2] = '\x06';
  auVar4[3] = '\a';
  auVar4[4] = '\x04';
  auVar4[5] = '\x05';
  auVar4[6] = '\x06';
  auVar4[7] = '\a';
  alVar10 = (__m128i)pshufb((undefined1  [16])aWVar6,auVar4);
  coeff[2] = alVar10;
  auVar3[8] = '\b';
  auVar3[9] = '\t';
  auVar3[10] = '\n';
  auVar3[0xb] = '\v';
  auVar3[0xc] = '\b';
  auVar3[0xd] = '\t';
  auVar3[0xe] = '\n';
  auVar3[0xf] = '\v';
  auVar3[0] = '\b';
  auVar3[1] = '\t';
  auVar3[2] = '\n';
  auVar3[3] = '\v';
  auVar3[4] = '\b';
  auVar3[5] = '\t';
  auVar3[6] = '\n';
  auVar3[7] = '\v';
  alVar10 = (__m128i)pshufb((undefined1  [16])aWVar7,auVar3);
  coeff[4] = alVar10;
  auVar2[8] = '\f';
  auVar2[9] = '\r';
  auVar2[10] = '\x0e';
  auVar2[0xb] = '\x0f';
  auVar2[0xc] = '\f';
  auVar2[0xd] = '\r';
  auVar2[0xe] = '\x0e';
  auVar2[0xf] = '\x0f';
  auVar2[0] = '\f';
  auVar2[1] = '\r';
  auVar2[2] = '\x0e';
  auVar2[3] = '\x0f';
  auVar2[4] = '\f';
  auVar2[5] = '\r';
  auVar2[6] = '\x0e';
  auVar2[7] = '\x0f';
  alVar10 = (__m128i)pshufb((undefined1  [16])aWVar8,auVar2);
  coeff[6] = alVar10;
  lVar1 = (*coeff)[1];
  coeff[1][0] = (*coeff)[0];
  coeff[1][1] = lVar1;
  lVar1 = coeff[2][1];
  coeff[3][0] = coeff[2][0];
  coeff[3][1] = lVar1;
  lVar1 = coeff[4][1];
  coeff[5][0] = coeff[4][0];
  coeff[5][1] = lVar1;
  lVar1 = coeff[6][1];
  coeff[7][0] = coeff[6][0];
  coeff[7][1] = lVar1;
  return;
}

Assistant:

static inline void highbd_prepare_horizontal_filter_coeff_alpha0(
    int sx, __m128i *coeff) {
  // Filter coeff
  const __m128i tmp_0 = _mm_loadu_si128(
      (__m128i *)(av1_warped_filter + (sx >> WARPEDDIFF_PREC_BITS)));

  coeff[0] = _mm_shuffle_epi8(
      tmp_0, _mm_loadu_si128((__m128i *)highbd_shuffle_alpha0_mask0));
  coeff[2] = _mm_shuffle_epi8(
      tmp_0, _mm_loadu_si128((__m128i *)highbd_shuffle_alpha0_mask1));
  coeff[4] = _mm_shuffle_epi8(
      tmp_0, _mm_loadu_si128((__m128i *)highbd_shuffle_alpha0_mask2));
  coeff[6] = _mm_shuffle_epi8(
      tmp_0, _mm_loadu_si128((__m128i *)highbd_shuffle_alpha0_mask3));

  coeff[1] = coeff[0];
  coeff[3] = coeff[2];
  coeff[5] = coeff[4];
  coeff[7] = coeff[6];
}